

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_DecMffcAreaReal(Abc_Obj_t *pPivot,Vec_Int_t *vCut,Vec_Int_t *vMffc)

{
  int *piVar1;
  Abc_Ntk_t *pNtk;
  int iVar2;
  int i;
  Abc_Obj_t *pAVar3;
  int iVar4;
  int i_00;
  
  if ((*(uint *)&pPivot->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x2c8,"int Sfm_DecMffcAreaReal(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  pNtk = pPivot->pNtk;
  if (vMffc != (Vec_Int_t *)0x0) {
    vMffc->nSize = 0;
  }
  for (iVar4 = 0; iVar4 < vCut->nSize; iVar4 = iVar4 + 1) {
    iVar2 = Vec_IntEntry(vCut,iVar4);
    pAVar3 = Abc_NtkObj(pNtk,iVar2);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      piVar1 = &(pAVar3->vFanouts).nSize;
      *piVar1 = *piVar1 + 1;
    }
  }
  iVar4 = Sfm_MffcDeref_rec(pPivot);
  iVar2 = Sfm_MffcRef_rec(pPivot,vMffc);
  for (i_00 = 0; i_00 < vCut->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vCut,i_00);
    pAVar3 = Abc_NtkObj(pNtk,i);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      piVar1 = &(pAVar3->vFanouts).nSize;
      *piVar1 = *piVar1 + -1;
    }
  }
  if (iVar4 == iVar2) {
    return iVar4;
  }
  __assert_fail("Area1 == Area2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                ,0x2d1,"int Sfm_DecMffcAreaReal(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Sfm_DecMffcAreaReal( Abc_Obj_t * pPivot, Vec_Int_t * vCut, Vec_Int_t * vMffc )
{
    Abc_Ntk_t * pNtk = pPivot->pNtk;
    Abc_Obj_t * pObj; 
    int i, Area1, Area2;
    assert( Abc_ObjIsNode(pPivot) );
    if ( vMffc )
        Vec_IntClear( vMffc );
    Abc_NtkForEachObjVec( vCut, pNtk, pObj, i )
        pObj->vFanouts.nSize++;
    Area1 = Sfm_MffcDeref_rec( pPivot );
    Area2 = Sfm_MffcRef_rec( pPivot, vMffc );
    Abc_NtkForEachObjVec( vCut, pNtk, pObj, i )
        pObj->vFanouts.nSize--;
    assert( Area1 == Area2 );
    return Area1;
}